

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O2

int excline(char *line,int llen,int lnum)

{
  char cVar1;
  byte bVar2;
  line *plVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  KEYMAP *pKVar8;
  KEYMAP *s;
  ulong uVar9;
  char *pcVar10;
  PF p_Var11;
  maps_s *pmVar12;
  line *plVar13;
  key *pkVar14;
  bool bVar15;
  long lVar16;
  int iVar17;
  char *local_68;
  char *tmp;
  PF local_58;
  line *local_50;
  int local_44;
  KEYMAP *local_40;
  KEYMAP *curmap;
  
  local_40 = (KEYMAP *)0x0;
  if (inmacro != 0 || macrodef != 0) {
    iVar4 = dobeep_msg("Not now!");
    return iVar4;
  }
  pcVar7 = skipwhite(line);
  if (*pcVar7 == '\0') {
    return 1;
  }
  if (*pcVar7 == '(') {
    iVar4 = foundparen(pcVar7,llen,lnum);
    return iVar4;
  }
  pKVar8 = (KEYMAP *)parsetoken(pcVar7);
  pcVar10 = (char *)0x1;
  iVar4 = 0;
  if ((char)pKVar8->map_num != '\0') {
    *(char *)&pKVar8->map_num = '\0';
    s = (KEYMAP *)skipwhite((char *)((long)&pKVar8->map_num + 1));
    uVar9 = (ulong)(byte)s->map_num;
    if ((uVar9 == 0x2d) || (pKVar8 = s, (cinfo[uVar9] & 0x20U) != 0)) {
      pKVar8 = (KEYMAP *)parsetoken((char *)s);
      pcVar10 = (char *)strtol((char *)s,&local_68,10);
      if (*local_68 != '\0') {
        return 0;
      }
      if (pcVar10 + -0x7fffffff < (char *)0xffffffff00000002) {
        return 0;
      }
      iVar4 = 7;
    }
  }
  p_Var11 = name_function(pcVar7);
  if (p_Var11 == (PF)0x0) {
    iVar4 = dobeep_msgs("Unknown function:",pcVar7);
    return iVar4;
  }
  if (p_Var11 == bindtokey || p_Var11 == unbindtokey) {
    pmVar12 = &fundamental_mode;
  }
  else {
    if (p_Var11 != localbind && p_Var11 != localunbind) {
      iVar17 = (p_Var11 == redefine_key) + 1;
      goto LAB_0010d99a;
    }
    pmVar12 = curbp->b_modes[curbp->b_nmodes];
  }
  local_40 = pmVar12->p_map;
  iVar17 = 0;
LAB_0010d99a:
  iVar6 = 0;
  curmap = pKVar8;
  local_50 = lalloc(0);
  if (local_50 != (line *)0x0) {
    maclcur = local_50;
    local_50->l_bp = local_50;
    local_50->l_fp = local_50;
    plVar13 = (line *)0x0;
    pKVar8 = curmap;
    tmp = pcVar10;
    local_58 = p_Var11;
    local_44 = iVar4;
LAB_0010d9e3:
    if ((char)pKVar8->map_num != '\0') {
      pcVar7 = skipwhite((char *)pKVar8);
      cVar1 = *pcVar7;
      if (cVar1 != '\0') {
        pKVar8 = (KEYMAP *)parsetoken(pcVar7);
        curmap = pKVar8;
        if (cVar1 != '\"') {
          if (cVar1 == '\'') {
            pcVar7 = pcVar7 + 1;
          }
          iVar4 = (int)pKVar8 - (int)pcVar7;
          plVar13 = lalloc(iVar4 + 1);
          if (plVar13 != (line *)0x0) {
            memmove(plVar13->l_text,pcVar7,(long)iVar4);
            plVar13->l_used = plVar13->l_used + -1;
            pKVar8 = curmap;
            iVar4 = iVar17 + (uint)(iVar17 == 0);
            goto LAB_0010dc11;
          }
          goto LAB_0010dd0f;
        }
        pcVar7 = pcVar7 + 1;
        pkVar14 = &key;
        if (iVar17 != 0) {
          plVar13 = lalloc(((int)pKVar8 - (int)pcVar7) + 1);
          if (plVar13 == (line *)0x0) goto LAB_0010dd0f;
          pkVar14 = (key *)&plVar13->l_used;
        }
        pkVar14->k_count = 0;
        do {
          cVar1 = *pcVar7;
          if (cVar1 == '\\') {
            pcVar10 = pcVar7 + 1;
            bVar2 = pcVar7[1];
            uVar5 = bVar2 - 0x30;
            if (uVar5 < 8) {
              if ((pcVar7[2] & 0xf8U) == 0x30) {
                uVar5 = (uint)(byte)(pcVar7[2] - 0x30) + uVar5 * 8;
                if ((pcVar7[3] & 0xf8U) == 0x30) {
                  pcVar10 = pcVar7 + 3;
                  uVar5 = (uint)(byte)(pcVar7[3] - 0x30) + uVar5 * 8;
                }
                else {
                  pcVar10 = pcVar7 + 2;
                }
              }
            }
            else if (bVar2 == 0x45) {
LAB_0010db56:
              uVar5 = 0x1b;
            }
            else if (bVar2 == 0x46) {
LAB_0010db5a:
              if ((cinfo[(byte)pcVar7[3]] & 0x20U) == 0) {
                pcVar10 = pcVar7 + 2;
                iVar4 = pcVar7[2] + -0x30;
              }
              else {
                pcVar10 = pcVar7 + 3;
                iVar4 = pcVar7[2] * 10 + (int)pcVar7[3] + -0x210;
              }
              uVar5 = iVar4 + 0x100;
            }
            else if (bVar2 == 0x4e) {
LAB_0010db19:
              uVar5 = 10;
            }
            else if (bVar2 == 0x52) {
LAB_0010db88:
              uVar5 = 0xd;
            }
            else if (bVar2 == 0x54) {
LAB_0010db84:
              uVar5 = 9;
            }
            else if (bVar2 == 0x5e) {
              bVar2 = pcVar7[2];
              uVar5 = (uint)bVar2;
              if ((cinfo[bVar2] & 4U) != 0) {
                uVar5 = bVar2 - 0x20;
              }
              pcVar10 = pcVar7 + 2;
              uVar5 = uVar5 ^ 0x40;
            }
            else {
              uVar5 = (uint)bVar2;
              if (uVar5 == 0x65) goto LAB_0010db56;
              if (uVar5 == 0x66) goto LAB_0010db5a;
              if (uVar5 == 0x74) goto LAB_0010db84;
              if (uVar5 == 0x72) goto LAB_0010db88;
              if (uVar5 == 0x6e) goto LAB_0010db19;
            }
          }
          else {
            if ((cVar1 == '\0') || (cVar1 == '\"')) goto LAB_0010dc01;
            uVar5 = (uint)cVar1;
            pcVar10 = pcVar7;
          }
          pcVar7 = pcVar10 + 1;
          if (iVar17 == 0) {
            lVar16 = (long)key.k_count;
            key.k_count = key.k_count + 1;
            key.k_chars[lVar16] = (KCHAR)uVar5;
          }
          else {
            iVar4 = plVar13->l_used;
            plVar13->l_used = iVar4 + 1;
            plVar13->l_text[iVar4] = (char)uVar5;
          }
        } while( true );
      }
    }
    if (iVar17 == 1) {
      inmacro = 1;
      maclcur = maclcur->l_fp;
      iVar6 = (*local_58)(local_44,(int)tmp);
      inmacro = 0;
    }
    else if (iVar17 == 3) {
      bVar15 = local_58 == localunbind || local_58 == unbindtokey;
      iVar4 = (int)CONCAT71(0x10d6,bVar15);
      if (bVar15) {
        pcVar7 = (char *)0x0;
      }
      else {
        iVar4 = plVar13->l_used;
        plVar13->l_text[iVar4] = '\0';
        pcVar7 = plVar13->l_text;
      }
      iVar6 = bindkey(&local_40,pcVar7,(KCHAR *)(ulong)(uint)key.k_count,iVar4);
    }
    else {
      dobeep_msg("Bad args to set key");
LAB_0010dd0f:
      iVar6 = 0;
    }
    plVar13 = maclcur->l_fp;
    while (plVar13 != maclcur) {
      plVar3 = plVar13->l_fp;
      free(plVar13);
      plVar13 = plVar3;
    }
    free(plVar13);
    maclhead = (line *)0x0;
    macrodef = 0;
  }
  return iVar6;
LAB_0010dc01:
  pKVar8 = (KEYMAP *)((long)pKVar8->map_element + ((ulong)((char)curmap->map_num != '\0') - 0x10));
  iVar4 = iVar17;
LAB_0010dc11:
  iVar17 = 3;
  if (iVar4 != 0) {
    if (iVar4 == 2) {
      plVar13->l_text[plVar13->l_used] = '\0';
      local_40 = name_map(plVar13->l_text);
      if (local_40 == (KEYMAP *)0x0) {
        dobeep_msgs("No such mode:",plVar13->l_text);
        free(plVar13);
        goto LAB_0010dd0f;
      }
      free(plVar13);
      iVar17 = 0;
    }
    else {
      plVar13->l_fp = local_50->l_fp;
      plVar13->l_bp = local_50;
      local_50->l_fp = plVar13;
      local_50 = plVar13;
      iVar17 = iVar4;
    }
  }
  goto LAB_0010d9e3;
}

Assistant:

int
excline(char *line, int llen, int lnum)
{
	PF	 fp;
	struct line	*lp, *np;
	int	 status, c, f, n;
	char	*funcp, *tmp;
	char	*argp = NULL;
	long	 nl;
	int	 bind;
	KEYMAP	*curmap = NULL;
#define BINDARG		0  /* this arg is key to bind (local/global set key) */
#define	BINDNO		1  /* not binding or non-quoted BINDARG */
#define BINDNEXT	2  /* next arg " (define-key) */
#define BINDDO		3  /* already found key to bind */
#define BINDEXT		1  /* space for trailing \0 */

	lp = NULL;

	if (macrodef || inmacro)
		return (dobeep_msg("Not now!"));

	f = 0;
	n = 1;
	funcp = skipwhite(line);
	if (*funcp == '\0')
		return (TRUE);	/* No error on blank lines */
	if (*funcp == '(')
		return (foundparen(funcp, llen, lnum));
	line = parsetoken(funcp);
	if (*line != '\0') {
		*line++ = '\0';
		line = skipwhite(line);
		if (ISDIGIT(*line) || *line == '-') {
			argp = line;
			line = parsetoken(line);
		}
	}
	if (argp != NULL) {
		f = FFARG;
		nl = strtol(argp, &tmp, 10);
		if (*tmp != '\0')
			return (FALSE);
		if (nl >= INT_MAX || nl <= INT_MIN)
			return (FALSE);
		n = (int)nl;
	}
	if ((fp = name_function(funcp)) == NULL)
		return (dobeep_msgs("Unknown function:", funcp));

	if (fp == bindtokey || fp == unbindtokey) {
		bind = BINDARG;
		curmap = fundamental_map;
	} else if (fp == localbind || fp == localunbind) {
		bind = BINDARG;
		curmap = curbp->b_modes[curbp->b_nmodes]->p_map;
	} else if (fp == redefine_key)
		bind = BINDNEXT;
	else
		bind = BINDNO;
	/* Pack away all the args now... */
	if ((np = lalloc(0)) == FALSE)
		return (FALSE);
	np->l_fp = np->l_bp = maclcur = np;
	while (*line != '\0') {
		argp = skipwhite(line);
		if (*argp == '\0')
			break;
		line = parsetoken(argp);
		if (*argp != '"') {
			if (*argp == '\'')
				++argp;
			if ((lp = lalloc((int) (line - argp) + BINDEXT)) ==
			    NULL) {
				status = FALSE;
				goto cleanup;
			}
			bcopy(argp, ltext(lp), (int)(line - argp));
			/* don't count BINDEXT */
			lp->l_used--;
			if (bind == BINDARG)
				bind = BINDNO;
		} else {
			/* quoted strings are special */
			++argp;
			if (bind != BINDARG) {
				lp = lalloc((int)(line - argp) + BINDEXT);
				if (lp == NULL) {
					status = FALSE;
					goto cleanup;
				}
				lp->l_used = 0;
			} else
				key.k_count = 0;
			while (*argp != '"' && *argp != '\0') {
				if (*argp != '\\')
					c = *argp++;
				else {
					switch (*++argp) {
					case 't':
					case 'T':
						c = CCHR('I');
						break;
					case 'n':
					case 'N':
						c = CCHR('J');
						break;
					case 'r':
					case 'R':
						c = CCHR('M');
						break;
					case 'e':
					case 'E':
						c = CCHR('[');
						break;
					case '^':
						/*
						 * split into two statements
						 * due to bug in OSK cpp
						 */
						c = CHARMASK(*++argp);
						c = ISLOWER(c) ?
						    CCHR(TOUPPER(c)) : CCHR(c);
						break;
					case '0':
					case '1':
					case '2':
					case '3':
					case '4':
					case '5':
					case '6':
					case '7':
						c = *argp - '0';
						if (argp[1] <= '7' &&
						    argp[1] >= '0') {
							c <<= 3;
							c += *++argp - '0';
							if (argp[1] <= '7' &&
							    argp[1] >= '0') {
								c <<= 3;
								c += *++argp
								    - '0';
							}
						}
						break;
					case 'f':
					case 'F':
						c = *++argp - '0';
						if (ISDIGIT(argp[1])) {
							c *= 10;
							c += *++argp - '0';
						}
						c += KFIRST;
						break;
					default:
						c = CHARMASK(*argp);
						break;
					}
					argp++;
				}
				if (bind == BINDARG)
					key.k_chars[key.k_count++] = c;
				else
					lp->l_text[lp->l_used++] = c;
			}
			if (*line)
				line++;
		}
		switch (bind) {
		case BINDARG:
			bind = BINDDO;
			break;
		case BINDNEXT:
			lp->l_text[lp->l_used] = '\0';
			if ((curmap = name_map(lp->l_text)) == NULL) {
				(void)dobeep_msgs("No such mode:", lp->l_text);
				status = FALSE;
				free(lp);
				goto cleanup;
			}
			free(lp);
			bind = BINDARG;
			break;
		default:
			lp->l_fp = np->l_fp;
			lp->l_bp = np;
			np->l_fp = lp;
			np = lp;
		}
	}
	switch (bind) {
	default:
		(void)dobeep_msg("Bad args to set key");
		status = FALSE;
		break;
	case BINDDO:
		if (fp != unbindtokey && fp != localunbind) {
			lp->l_text[lp->l_used] = '\0';
			status = bindkey(&curmap, lp->l_text, key.k_chars,
			    key.k_count);
		} else
			status = bindkey(&curmap, NULL, key.k_chars,
			    key.k_count);
		break;
	case BINDNO:
		inmacro = TRUE;
		maclcur = maclcur->l_fp;
		status = (*fp)(f, n);
		inmacro = FALSE;
	}
cleanup:
	lp = maclcur->l_fp;
	while (lp != maclcur) {
		np = lp->l_fp;
		free(lp);
		lp = np;
	}
	free(lp);
	maclhead = NULL;
	macrodef = FALSE;
	return (status);
}